

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_types.hpp
# Opt level: O2

archive_result_type<pstore::serialize::archive::database_writer_&>
pstore::serialize::string_helper::
write<pstore::serialize::archive::database_writer&,pstore::sstring_view<char_const*>>
          (database_writer *archive,sstring_view<const_char_*> *str)

{
  uchar *last;
  result_type rVar1;
  long lVar2;
  span<unsigned_char,__1L> sp;
  span<const_char,__1L> sp_00;
  array<unsigned_char,_9UL> encoded_length;
  
  last = varint::encode<unsigned_char*>(str->size_,encoded_length._M_elems);
  lVar2 = (long)last - (long)&encoded_length;
  if (0xfffffffffffffff6 < lVar2 - 10U) {
    if (lVar2 == 1) {
      *last = '\0';
      last = last + 1;
    }
    sp = gsl::make_span<unsigned_char>(encoded_length._M_elems,last);
    rVar1 = serialize::archive::
            writer_base<pstore::serialize::archive::details::database_writer_policy>::
            putn<pstore::gsl::span<unsigned_char,_1l>>
                      (&archive->
                        super_writer_base<pstore::serialize::archive::details::database_writer_policy>
                       ,sp);
    sp_00 = gsl::make_span<pstore::sstring_view<char_const*>>(str);
    serialize::archive::writer_base<pstore::serialize::archive::details::database_writer_policy>::
    putn<pstore::gsl::span<char_const,_1l>>
              (&archive->
                super_writer_base<pstore::serialize::archive::details::database_writer_policy>,sp_00
              );
    return (archive_result_type<pstore::serialize::archive::database_writer_&>)rVar1.a_;
  }
  assert_failed("length_bytes > 0 && static_cast<std::size_t> (length_bytes) <= encoded_length.size ()"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/standard_types.hpp"
                ,0x3e);
}

Assistant:

static auto write (Archive && archive, StringType const & str)
                -> archive_result_type<Archive> {
                auto const length = str.length ();

                // Encode the string length as a variable-length integer.
                std::array<std::uint8_t, varint::max_output_length> encoded_length;
                auto first = std::begin (encoded_length);
                auto last = varint::encode (length, first);
                auto length_bytes = std::distance (first, last);
                PSTORE_ASSERT (length_bytes > 0 &&
                               static_cast<std::size_t> (length_bytes) <= encoded_length.size ());
                if (length_bytes == 1) {
                    *(last++) = 0;
                }
                // Emit the string length.
                auto const resl = serialize::write (archive, gsl::make_span (&(*first), &(*last)));

                // Emit the string body.
                serialize::write (archive, gsl::make_span (str));
                return resl;
            }